

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall duckdb::ReservoirSample::NormalizeWeights(ReservoirSample *this)

{
  double dVar1;
  pointer ppVar2;
  long lVar3;
  unsigned_long uVar4;
  iterator iVar5;
  unsigned_long *puVar6;
  pointer pBVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  pair<double,_unsigned_long> *ppVar10;
  ulong uVar11;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  __normal_iterator<std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
  __i;
  long lVar12;
  pair<double,_unsigned_long> *ppVar13;
  unsigned_long *puVar14;
  vector<std::pair<double,_unsigned_long>,_true> tmp_weights;
  value_type top;
  pair<double,_unsigned_long> *local_58;
  iterator iStack_50;
  pair<double,_unsigned_long> *local_48;
  pair<double,_unsigned_long> local_38;
  
  local_58 = (pair<double,_unsigned_long> *)0x0;
  iStack_50._M_current = (pair<double,_unsigned_long> *)0x0;
  local_48 = (pair<double,_unsigned_long> *)0x0;
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  while (pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                  ::operator->(this_00), iVar5._M_current = iStack_50._M_current, ppVar10 = local_58
        , (pBVar7->reservoir_weights).c.
          super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar7->reservoir_weights).c.
          super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ppVar2 = (pBVar7->reservoir_weights).c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38.first = ppVar2->first;
    local_38.second = ppVar2->second;
    if (iStack_50._M_current == local_48) {
      ::std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>
      ::_M_realloc_insert<std::pair<double,unsigned_long>>
                ((vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>
                  *)&local_58,iStack_50,&local_38);
    }
    else {
      uVar4 = ppVar2->second;
      (iStack_50._M_current)->first = ppVar2->first;
      (iStack_50._M_current)->second = uVar4;
      iStack_50._M_current = iStack_50._M_current + 1;
    }
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::pop(&pBVar7->reservoir_weights);
  }
  if (local_58 != iStack_50._M_current) {
    lVar12 = (long)iStack_50._M_current - (long)local_58;
    uVar8 = lVar12 >> 4;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
              (local_58,iStack_50._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar12 < 0x101) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
                (ppVar10,iVar5._M_current);
    }
    else {
      ppVar13 = ppVar10 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
                (ppVar10,ppVar13);
      if (ppVar13 != iVar5._M_current) {
        puVar14 = &ppVar10[0x10].second;
        do {
          dVar1 = ppVar13->first;
          uVar8 = ppVar13->second;
          uVar11 = ppVar13[-1].second;
          ppVar10 = ppVar13;
          puVar6 = puVar14;
          if (uVar8 < uVar11) {
            do {
              puVar9 = puVar6;
              ((pair<double,_unsigned_long> *)(puVar9 + -1))->first = (double)puVar9[-3];
              *puVar9 = uVar11;
              uVar11 = puVar9[-4];
              puVar6 = puVar9 + -2;
            } while (uVar8 < uVar11);
            ppVar10 = (pair<double,_unsigned_long> *)(puVar9 + -3);
          }
          ppVar10->first = dVar1;
          ppVar10->second = uVar8;
          ppVar13 = ppVar13 + 1;
          puVar14 = puVar14 + 2;
        } while (ppVar13 != iVar5._M_current);
      }
    }
  }
  local_38.first = 0.0;
  if (iStack_50._M_current != local_58) {
    do {
      pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_00);
      if ((ulong)((long)iStack_50._M_current - (long)local_58 >> 4) <= (ulong)local_38.first) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      ::std::
      priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
      ::emplace<double&,unsigned_long&>
                ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
                  *)&pBVar7->reservoir_weights,&local_58[(long)local_38.first].first,
                 (unsigned_long *)&local_38);
      local_38.first = (double)((long)local_38.first + 1);
    } while ((ulong)local_38.first < (ulong)((long)iStack_50._M_current - (long)local_58 >> 4));
  }
  pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  BaseReservoirSampling::SetNextEntry(pBVar7);
  if (local_58 != (pair<double,_unsigned_long> *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void ReservoirSample::NormalizeWeights() {
	vector<std::pair<double, idx_t>> tmp_weights;
	while (!base_reservoir_sample->reservoir_weights.empty()) {
		auto top = base_reservoir_sample->reservoir_weights.top();
		tmp_weights.push_back(std::move(top));
		base_reservoir_sample->reservoir_weights.pop();
	}
	std::sort(tmp_weights.begin(), tmp_weights.end(),
	          [&](std::pair<double, idx_t> a, std::pair<double, idx_t> b) { return a.second < b.second; });
	for (idx_t i = 0; i < tmp_weights.size(); i++) {
		base_reservoir_sample->reservoir_weights.emplace(tmp_weights.at(i).first, i);
	}
	base_reservoir_sample->SetNextEntry();
}